

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O3

void mh_assoc_del_resize(mh_assoc_t *h,mh_int_t x,void *arg)

{
  uint uVar1;
  uint uVar2;
  assoc_val **ppaVar3;
  mh_assoc_t *h_00;
  assoc_val *paVar4;
  mh_int_t *pmVar5;
  char *pcVar6;
  ulong uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  sbyte sVar11;
  char *__s2;
  char *pcVar12;
  uint uVar13;
  
  ppaVar3 = h->p;
  h_00 = h->shadow;
  pcVar6 = (char *)(ulong)x;
  paVar4 = ppaVar3[(long)pcVar6];
  uVar8 = PMurHash32(0xd,(paVar4->key).id,(paVar4->key).id_len);
  uVar1 = h_00->n_buckets;
  pcVar12 = (char *)((ulong)uVar8 % (ulong)uVar1);
  __s2 = (char *)(ulong)(uVar1 - 1);
  pmVar5 = h_00->b;
  do {
    uVar13 = (uint)pcVar12;
    uVar7 = (ulong)pcVar12 >> 4;
    uVar10 = pmVar5[uVar7];
    sVar11 = (sbyte)(uVar13 & 0xf);
    if ((uVar10 >> (uVar13 & 0xf) & 1) != 0) {
      paVar4 = ppaVar3[(long)pcVar6];
      uVar2 = (paVar4->key).id_len;
      __s2 = pcVar6;
      if (uVar2 == (h_00->p[(long)pcVar12]->key).id_len) {
        __s2 = (h_00->p[(long)pcVar12]->key).id;
        iVar9 = bcmp((paVar4->key).id,__s2,(ulong)uVar2);
        if (iVar9 == 0) {
          if (uVar1 != uVar13) {
            pmVar5[uVar7] = uVar10 & ~(1 << sVar11);
            h_00->size = h_00->size - 1;
            if (((pmVar5[uVar7] >> sVar11) >> 0x10 & 1) == 0) {
              h_00->n_dirty = h_00->n_dirty - 1;
            }
            if (h_00->resize_position != 0) {
              mh_assoc_del_resize(h_00,uVar13,arg);
              __s2 = pcVar12;
            }
          }
LAB_00124907:
          mh_assoc_resize(h,__s2);
          return;
        }
      }
    }
    if (((uVar10 >> sVar11) >> 0x10 & 1) == 0) goto LAB_00124907;
    uVar13 = uVar13 + uVar8 % (uVar1 - 1) + 1;
    uVar10 = uVar1;
    if (uVar13 < uVar1) {
      uVar10 = 0;
    }
    pcVar12 = (char *)(ulong)(uVar13 - uVar10);
  } while( true );
}

Assistant:

void __attribute__((noinline))
_mh(del_resize)(struct _mh(t) *h, mh_int_t x,
		mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
	uint32_t y = _mh(get)(s, (const mh_node_t *) &(h->p[x]),
			      arg);
	_mh(del)(s, y, arg);
	_mh(resize)(h, arg);
}